

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaItemListAdd(xmlSchemaItemListPtr list,void *item)

{
  int iVar1;
  void **ppvVar2;
  
  ppvVar2 = list->items;
  if (ppvVar2 == (void **)0x0) {
    ppvVar2 = (void **)(*xmlMalloc)(0xa0);
    list->items = ppvVar2;
    if (ppvVar2 == (void **)0x0) {
      xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"allocating new item list",(xmlNodePtr)0x0);
      return -1;
    }
    list->sizeItems = 0x14;
  }
  else {
    iVar1 = list->sizeItems;
    if (iVar1 <= list->nbItems) {
      list->sizeItems = iVar1 * 2;
      ppvVar2 = (void **)(*xmlRealloc)(ppvVar2,(long)iVar1 << 4);
      list->items = ppvVar2;
      if (ppvVar2 == (void **)0x0) {
        xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0,"growing item list",(xmlNodePtr)0x0);
        list->sizeItems = 0;
        return -1;
      }
    }
  }
  iVar1 = list->nbItems;
  list->nbItems = iVar1 + 1;
  ppvVar2[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaItemListAdd(xmlSchemaItemListPtr list, void *item)
{
    if (list->items == NULL) {
	list->items = (void **) xmlMalloc(
	    20 * sizeof(void *));
	if (list->items == NULL) {
	    xmlSchemaPErrMemory(NULL, "allocating new item list", NULL);
	    return(-1);
	}
	list->sizeItems = 20;
    } else if (list->sizeItems <= list->nbItems) {
	list->sizeItems *= 2;
	list->items = (void **) xmlRealloc(list->items,
	    list->sizeItems * sizeof(void *));
	if (list->items == NULL) {
	    xmlSchemaPErrMemory(NULL, "growing item list", NULL);
	    list->sizeItems = 0;
	    return(-1);
	}
    }
    list->items[list->nbItems++] = item;
    return(0);
}